

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O1

void __thiscall
ModelFlattening_multiLayeredImportOfNonStandardUnits_Test::TestBody
          (ModelFlattening_multiLayeredImportOfNonStandardUnits_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  ModelPtr flattenModel;
  ImporterPtr importer;
  ValidatorPtr validator;
  ModelPtr model;
  ParserPtr parser;
  long *local_a8;
  long *local_a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  long local_90 [2];
  AssertionResult local_80;
  long local_70 [2];
  AssertHelper local_60 [8];
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"importer/periodicstimulus/experiments/periodic-stimulus.xml","");
  fileContents((string *)&local_80);
  libcellml::Parser::parseModel(local_38);
  if ((long *)CONCAT71(local_80._1_7_,local_80.success_) != local_70) {
    operator_delete((long *)CONCAT71(local_80._1_7_,local_80.success_),local_70[0] + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  local_a0 = (long *)0x0;
  local_48 = (shared_ptr *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(0)","parser->errorCount()",(unsigned_long *)&local_a0,
             (unsigned_long *)&local_48);
  if (local_80.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x787,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_a0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Validator::create();
  libcellml::Validator::validateModel(local_48);
  local_a0 = (long *)0x0;
  local_58 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(0)","validator->issueCount()",(unsigned_long *)&local_a0,
             (unsigned_long *)&local_58);
  if (local_80.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x78d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_a0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_a0 = (long *)CONCAT71(local_a0._1_7_,cVar2);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_a0,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x78e,(char *)CONCAT71(local_80._1_7_,local_80.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)CONCAT71(local_80._1_7_,local_80.success_) != local_70) {
      operator_delete((long *)CONCAT71(local_80._1_7_,local_80.success_),local_70[0] + 1);
    }
    if (local_58 != (shared_ptr *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (shared_ptr *)0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      local_58 = (shared_ptr *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::create(SUB81(&local_58,0));
  psVar1 = local_58;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"importer/periodicstimulus/experiments","");
  resourcePath((string *)&local_80);
  libcellml::Importer::resolveImports(psVar1,local_38);
  if ((long *)CONCAT71(local_80._1_7_,local_80.success_) != local_70) {
    operator_delete((long *)CONCAT71(local_80._1_7_,local_80.success_),local_70[0] + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_a0 = (long *)(CONCAT71(local_a0._1_7_,cVar2) ^ 1);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_a0,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x794,(char *)CONCAT71(local_80._1_7_,local_80.success_));
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)CONCAT71(local_80._1_7_,local_80.success_) != local_70) {
      operator_delete((long *)CONCAT71(local_80._1_7_,local_80.success_),local_70[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::flattenModel((shared_ptr *)&local_80);
  local_a8 = (long *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            ((internal *)&local_a0,"nullptr","flattenModel",&local_a8,
             (shared_ptr<libcellml::Model> *)&local_80);
  if (local_a0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x798,pcVar3);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(ModelFlattening, multiLayeredImportOfNonStandardUnits)
{
    auto parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("importer/periodicstimulus/experiments/periodic-stimulus.xml"));

    EXPECT_EQ(size_t(0), parser->errorCount());

    auto validator = libcellml::Validator::create();

    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
    EXPECT_TRUE(model->hasUnresolvedImports());

    auto importer = libcellml::Importer::create(false);

    importer->resolveImports(model, resourcePath("importer/periodicstimulus/experiments"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flattenModel = importer->flattenModel(model);

    EXPECT_NE(nullptr, flattenModel);
}